

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-pta-dump.cpp
# Opt level: O1

void dumpNodeToDot(PSNode *node,PTType type)

{
  int iVar1;
  long *plVar2;
  undefined8 *puVar3;
  ulong uVar4;
  PSNode *pPVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  byte bVar9;
  long lVar10;
  undefined8 *puVar11;
  char *__format;
  long *plVar12;
  const_iterator __begin1;
  const_iterator local_50;
  PSNode *local_38;
  
  uVar7 = 0;
  printf("\tNODE%u [label=\"<%u> ",(ulong)*(uint *)(node + 8));
  printPSNodeType(*(PSNodeType *)(node + 0x90));
  printf("\\n");
  printName(node,true);
  if (*(uint **)(node + 0xa0) != (uint *)0x0) {
    uVar7 = **(uint **)(node + 0xa0);
  }
  printf("\\nparent: %u\\n",(ulong)uVar7);
  if (((node != (PSNode *)0x0) && (*(int *)(node + 0x90) == 1)) &&
     ((*(long *)(node + 0x88) != 0 || ((node[0xe9] != (PSNode)0x0 || (node[0xe8] == (PSNode)0x1)))))
     ) {
    printf("\\n[size: %zu, heap: %u, zeroed: %u]",*(long *)(node + 0x88),(ulong)(byte)node[0xe9]);
  }
  if (verbose[0x80] == '\x01') {
    if ((node != (PSNode *)0x0) && (*(int *)(node + 0x90) == 0xb)) {
      printf("called from: [");
      plVar2 = *(long **)(node + 0x110);
      for (plVar12 = *(long **)(node + 0x108); plVar12 != plVar2; plVar12 = plVar12 + 1) {
        printf("%u ",(ulong)*(uint *)(*plVar12 + 8));
      }
      printf("]\\n");
    }
    if ((node != (PSNode *)0x0) && (*(int *)(node + 0x90) == 10)) {
      printf("returns from: [");
      plVar2 = *(long **)(node + 0xf0);
      for (plVar12 = *(long **)(node + 0xe8); plVar12 != plVar2; plVar12 = plVar12 + 1) {
        printf("%u ",(ulong)*(uint *)(*plVar12 + 8));
      }
      printf("]\\n");
    }
    if ((node != (PSNode *)0x0) && (*(int *)(node + 0x90) == 0xc)) {
      printf("returns to: [");
      plVar2 = *(long **)(node + 0xf0);
      for (plVar12 = *(long **)(node + 0xe8); plVar12 != plVar2; plVar12 = plVar12 + 1) {
        printf("%u ",(ulong)*(uint *)(*plVar12 + 8));
      }
      printf("]\\n");
    }
  }
  if ((verbose[0x80] == '\x01') && (*(long *)(node + 0x60) != *(long *)(node + 0x58))) {
    printf("\\n--- operands ---\\n");
    puVar3 = *(undefined8 **)(node + 0x60);
    for (puVar11 = *(undefined8 **)(node + 0x58); puVar11 != puVar3; puVar11 = puVar11 + 1) {
      printName((PSNode *)*puVar11,true);
    }
    printf("\\n------\\n");
  }
  if ((verbose[0x80] == '\x01') && (*(long *)(node + 200) != 0)) {
    printf("\\n--- points-to set ---\\n");
  }
  lVar6 = dg::Offset::UNKNOWN;
  local_50.container_it.
  super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur =
       *(_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false> *)(node + 0xc0);
  local_50.container_end.
  super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)(__node_type *)0x0
  ;
  local_50.pos = 0;
  if (*(long *)(node + 200) != 0) {
    uVar4 = *(ulong *)((long)&(((__node_type *)
                               local_50.container_it.
                               super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                               ._M_cur)->
                              super__Hash_node_value<std::pair<const_unsigned_long,_unsigned_long>,_false>
                              ).
                              super__Hash_node_value_base<std::pair<const_unsigned_long,_unsigned_long>_>
                              ._M_storage._M_storage + 8);
    if ((uVar4 & 1) == 0) {
      local_50.pos = 0;
      do {
        if (local_50.pos == 0x3f) {
          local_50.pos = 0x40;
          break;
        }
        bVar9 = (byte)local_50.pos;
        local_50.pos = local_50.pos + 1;
      } while ((uVar4 >> (bVar9 & 0x3f) & 2) == 0);
    }
    else {
      local_50.pos = 0;
    }
  }
  local_38 = node;
  if (local_50.pos != 0 ||
      local_50.container_it.
      super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur !=
      (__node_type *)0x0) {
    do {
      lVar8 = local_50.pos * 0x10 + __M_assign;
      lVar10 = *(long *)((long)local_50.container_it.
                               super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                               ._M_cur + 8) * 0x10;
      pPVar5 = *(PSNode **)(lVar10 + -0x10 + lVar8);
      lVar8 = *(long *)(lVar10 + -8 + lVar8);
      printf("\\n    -> ");
      printName(pPVar5,true);
      printf(" + ");
      if (lVar8 == lVar6) {
        printf("Offset::UNKNOWN");
      }
      else {
        printf("%lu",lVar8);
      }
      dg::ADT::
      SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
      ::const_iterator::operator++(&local_50);
    } while (local_50.container_it.
             super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur
             != (__node_type *)0x0 || local_50.pos != 0);
  }
  pPVar5 = local_38;
  if (verbose[0x80] != '\0') {
    dumpPointerGraphData(local_38,type,true);
  }
  printf("\", shape=box");
  iVar1 = *(int *)(pPVar5 + 0x90);
  if (iVar1 == 3) {
    __format = ", style=filled, fillcolor=orange";
  }
  else {
    if (((*(long *)(pPVar5 + 200) != 0) || (uVar7 = iVar1 - 2, 4 < uVar7)) ||
       ((0x1dU >> (uVar7 & 0x1f) & 1) == 0)) goto LAB_00112f06;
    __format = ", style=filled, fillcolor=red";
  }
  printf(__format);
LAB_00112f06:
  puts("]");
  return;
}

Assistant:

static void dumpNodeToDot(PSNode *node, PTType type) {
    printf("\tNODE%u [label=\"<%u> ", node->getID(), node->getID());
    printPSNodeType(node->getType());
    printf("\\n");
    printName(node, true);
    printf("\\nparent: %u\\n",
           node->getParent() ? node->getParent()->getID() : 0);

    PSNodeAlloc *alloc = PSNodeAlloc::get(node);
    if (alloc &&
        (alloc->getSize() || alloc->isHeap() || alloc->isZeroInitialized()))
        printf("\\n[size: %zu, heap: %u, zeroed: %u]", alloc->getSize(),
               alloc->isHeap(), alloc->isZeroInitialized());
    if (verbose) {
        if (PSNodeEntry *entry = PSNodeEntry::get(node)) {
            printf("called from: [");
            for (auto *r : entry->getCallers())
                printf("%u ", r->getID());
            printf("]\\n");
        }
        if (PSNodeCallRet *CR = PSNodeCallRet::get(node)) {
            printf("returns from: [");
            for (auto *r : CR->getReturns())
                printf("%u ", r->getID());
            printf("]\\n");
        }
        if (PSNodeRet *R = PSNodeRet::get(node)) {
            printf("returns to: [");
            for (auto *r : R->getReturnSites())
                printf("%u ", r->getID());
            printf("]\\n");
        }
    }

    if (verbose && node->getOperandsNum() > 0) {
        printf("\\n--- operands ---\\n");
        for (PSNode *op : node->getOperands()) {
            printName(op, true);
        }
        printf("\\n------\\n");
    }

    if (verbose && !node->pointsTo.empty()) {
        printf("\\n--- points-to set ---\\n");
    }

    for (const Pointer &ptr : node->pointsTo) {
        printf("\\n    -> ");
        printName(ptr.target, true);
        printf(" + ");
        if (ptr.offset.isUnknown())
            printf("Offset::UNKNOWN");
        else
            printf("%" PRIu64, *ptr.offset);
    }

    if (verbose) {
        dumpPointerGraphData(node, type, true /* dot */);
    }

    printf("\", shape=box");
    if (node->getType() != PSNodeType::STORE) {
        if (node->pointsTo.empty() && (node->getType() == PSNodeType::LOAD ||
                                       node->getType() == PSNodeType::GEP ||
                                       node->getType() == PSNodeType::CAST ||
                                       node->getType() == PSNodeType::PHI))
            printf(", style=filled, fillcolor=red");
    } else {
        printf(", style=filled, fillcolor=orange");
    }

    printf("]\n");
}